

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::VersionString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,int version)

{
  int iVar1;
  allocator local_a9;
  char local_a8 [8];
  char buffer [128];
  int micro;
  int minor;
  int major;
  int version_local;
  
  iVar1 = (int)this;
  snprintf(local_a8,0x80,"%d.%d.%d",(ulong)(uint)(iVar1 / 1000000),
           (ulong)(uint)((iVar1 / 1000) % 1000),(ulong)(uint)(iVar1 % 1000));
  buffer[0x77] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return __return_storage_ptr__;
}

Assistant:

string VersionString(int version) {
  int major = version / 1000000;
  int minor = (version / 1000) % 1000;
  int micro = version % 1000;

  // 128 bytes should always be enough, but we use snprintf() anyway to be
  // safe.
  char buffer[128];
  snprintf(buffer, sizeof(buffer), "%d.%d.%d", major, minor, micro);

  // Guard against broken MSVC snprintf().
  buffer[sizeof(buffer)-1] = '\0';

  return buffer;
}